

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  ulong uVar1;
  char *pcVar2;
  CURLcode CVar3;
  long lVar4;
  unsigned_long uVar5;
  char *pcVar6;
  size_t insize;
  long lVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  uVar5 = authstatus->picked;
  pcVar10 = (char *)0x0;
  if ((long)uVar5 < 8) {
    if (uVar5 != 1) {
      if (uVar5 == 2) {
        CVar3 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        pcVar10 = "Digest";
        goto LAB_00122fe5;
      }
      goto LAB_00122fe9;
    }
    uVar1 = *(ulong *)&(conn->bits).field_0x4;
    if (!proxy) {
      if ((((uint)uVar1 >> 0xb & 1) != 0) &&
         (pcVar10 = Curl_checkheaders(data,"Authorization"), pcVar10 == (char *)0x0)) {
        lVar9 = 0x1300;
        lVar4 = 0x1338;
        lVar7 = 0x1340;
        goto LAB_001230dd;
      }
LAB_00122fd5:
      pcVar10 = (char *)0x0;
LAB_00122fd8:
      authstatus->field_0x18 = authstatus->field_0x18 | 1;
      goto LAB_00122fe5;
    }
    if (((uVar1 & 4) == 0) ||
       (pcVar10 = Curl_checkProxyheaders(data,conn,"Proxy-authorization"), pcVar10 != (char *)0x0))
    goto LAB_00122fd5;
    lVar9 = 0x12e8;
    lVar4 = 0x1348;
    lVar7 = 0x1350;
LAB_001230dd:
    local_38 = 0;
    local_48 = (char *)0x0;
    pcVar10 = *(char **)((long)&data->magic + lVar7);
    pcVar6 = "";
    if (pcVar10 == (char *)0x0) {
      pcVar10 = "";
    }
    pcVar10 = curl_maprintf("%s:%s",*(undefined8 *)((long)&data->magic + lVar4),pcVar10);
    if (pcVar10 != (char *)0x0) {
      local_40 = lVar9;
      insize = strlen(pcVar10);
      CVar3 = Curl_base64_encode(data,pcVar10,insize,&local_48,&local_38);
      lVar4 = local_40;
      if (CVar3 != CURLE_OK) {
LAB_0012313e:
        (*Curl_cfree)(pcVar10);
        return CVar3;
      }
      if (local_48 == (char *)0x0) {
        CVar3 = CURLE_REMOTE_ACCESS_DENIED;
        goto LAB_0012313e;
      }
      (*Curl_cfree)(*(void **)((long)&data->magic + local_40));
      if (proxy) {
        pcVar6 = "Proxy-";
      }
      pcVar6 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar6,local_48);
      *(char **)((long)&data->magic + lVar4) = pcVar6;
      (*Curl_cfree)(local_48);
      if (*(long *)((long)&data->magic + lVar4) == 0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
        goto LAB_0012313e;
      }
      (*Curl_cfree)(pcVar10);
      pcVar10 = "Basic";
      goto LAB_00122fd8;
    }
LAB_0012314f:
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (uVar5 == 8) {
      CVar3 = Curl_output_ntlm(data,proxy);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar10 = "NTLM";
    }
    else {
      if (uVar5 != 0x80) goto LAB_00122fe9;
      CVar3 = Curl_output_aws_sigv4(data,proxy);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar10 = "AWS_SIGV4";
    }
LAB_00122fe5:
    uVar5 = authstatus->picked;
LAB_00122fe9:
    if (uVar5 == 0x40) {
      if (((!proxy) && ((data->set).str[0x41] != (char *)0x0)) &&
         (pcVar6 = Curl_checkheaders(data,"Authorization"), pcVar6 == (char *)0x0)) {
        (*Curl_cfree)((data->state).aptr.userpwd);
        pcVar10 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x41]);
        (data->state).aptr.userpwd = pcVar10;
        if (pcVar10 == (char *)0x0) goto LAB_0012314f;
        pcVar10 = "Bearer";
      }
      authstatus->field_0x18 = authstatus->field_0x18 | 1;
    }
    if (pcVar10 == (char *)0x0) {
      authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
      CVar3 = CURLE_OK;
    }
    else {
      pcVar6 = "Server";
      if (proxy) {
        pcVar6 = "Proxy";
      }
      pcVar2 = (&(data->state).aptr.user)[(ulong)proxy * 2];
      pcVar8 = "";
      if (pcVar2 != (char *)0x0) {
        pcVar8 = pcVar2;
      }
      CVar3 = CURLE_OK;
      Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar6,pcVar10,pcVar8);
      authstatus->field_0x18 =
           (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, "Proxy-authorization")) ||
#endif
      (!proxy && conn->bits.user_passwd &&
       !Curl_checkheaders(data, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, "Authorization"))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}